

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O3

void button_binding_grab(natwm_state *state,xcb_window_t window,button_binding *binding)

{
  ushort uVar1;
  toggle_modifiers *ptVar2;
  ushort *puVar3;
  undefined8 uVar4;
  
  uVar4 = 0x104a5d;
  xcb_grab_button(state->xcb,binding->pass_event,window,binding->mask,binding->pointer_mode,
                  binding->keyboard_mode,0,binding->cursor,binding->button,binding->modifiers,
                  0x104a5d);
  ptVar2 = state->button_state->modifiers;
  if (ptVar2 != (toggle_modifiers *)0x0) {
    puVar3 = ptVar2->masks;
    uVar1 = *puVar3;
    while (uVar1 != 0) {
      puVar3 = puVar3 + 1;
      xcb_grab_button(state->xcb,binding->pass_event,window,binding->mask,binding->pointer_mode,
                      binding->keyboard_mode,0,binding->cursor,binding->button,
                      uVar1 | binding->modifiers,uVar4);
      uVar1 = *puVar3;
    }
  }
  return;
}

Assistant:

void button_binding_grab(const struct natwm_state *state, xcb_window_t window,
                         const struct button_binding *binding)
{
        xcb_grab_button(state->xcb,
                        binding->pass_event,
                        window,
                        binding->mask,
                        binding->pointer_mode,
                        binding->keyboard_mode,
                        XCB_NONE,
                        binding->cursor,
                        binding->button,
                        binding->modifiers);

        struct toggle_modifiers *modifiers = state->button_state->modifiers;

        if (modifiers == NULL) {
                return;
        }

        for (uint16_t *mask = modifiers->masks; *mask != XCB_NONE; mask++) {
                xcb_grab_button(state->xcb,
                                binding->pass_event,
                                window,
                                binding->mask,
                                binding->pointer_mode,
                                binding->keyboard_mode,
                                XCB_NONE,
                                binding->cursor,
                                binding->button,
                                binding->modifiers | *mask);
        }
}